

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void lddmc_refs_tasks_up(lddmc_refs_internal_t lddmc_refs_key)

{
  long lVar1;
  lddmc_refs_task_t plVar2;
  long size;
  lddmc_refs_internal_t lddmc_refs_key_local;
  
  lVar1 = (long)lddmc_refs_key->send - (long)lddmc_refs_key->sbegin >> 4;
  plVar2 = (lddmc_refs_task_t)realloc(lddmc_refs_key->sbegin,lVar1 << 5);
  lddmc_refs_key->sbegin = plVar2;
  lddmc_refs_key->scur = lddmc_refs_key->sbegin + lVar1;
  lddmc_refs_key->send = lddmc_refs_key->sbegin + lVar1 * 2;
  return;
}

Assistant:

void __attribute__((noinline))
lddmc_refs_tasks_up(lddmc_refs_internal_t lddmc_refs_key)
{
    long size = lddmc_refs_key->send - lddmc_refs_key->sbegin;
    lddmc_refs_key->sbegin = (lddmc_refs_task_t)realloc(lddmc_refs_key->sbegin, sizeof(struct lddmc_refs_task) * size * 2);
    lddmc_refs_key->scur = lddmc_refs_key->sbegin + size;
    lddmc_refs_key->send = lddmc_refs_key->sbegin + (size * 2);
}